

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::on_bin
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_00;
  bin_writer<1> f;
  bool bVar1;
  char cVar2;
  uint uVar3;
  string_view prefix;
  undefined4 uStack_2c;
  uint num_digits;
  int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  bVar1 = basic_format_specs<char>::flag(this->spec,8);
  if (bVar1) {
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = '0';
    cVar2 = basic_format_specs<char>::type(this->spec);
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = cVar2;
  }
  uVar3 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
          int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::count_digits<1u>
                    ((int_writer<unsigned_long,fmt::v5::basic_format_specs<char>> *)this);
  this_00 = this->writer;
  prefix = get_prefix(this);
  f._12_4_ = uStack_2c;
  f.num_digits = uVar3;
  f.abs_value = this->abs_value;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this_00,uVar3,prefix,this->spec,f);
  return;
}

Assistant:

void on_bin() {
      if (spec.flag(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type());
      }
      unsigned num_digits = count_digits<1>();
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<1>{abs_value, num_digits});
    }